

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlChar * xmlParseStartTag(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar xVar2;
  uint uVar3;
  byte *pbVar4;
  startElementSAXFunc p_Var5;
  xmlChar *pxVar6;
  int iVar7;
  xmlChar *pxVar8;
  xmlChar *str2;
  xmlChar **ppxVar9;
  xmlParserInputPtr pxVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  xmlChar **ppxVar15;
  long lVar16;
  xmlChar *attvalue;
  
  pxVar10 = ctxt->input;
  pxVar8 = pxVar10->cur;
  if (*pxVar8 == '<') {
    ppxVar15 = ctxt->atts;
    uVar3 = ctxt->maxatts;
    pxVar10->col = pxVar10->col + 1;
    pxVar10->cur = pxVar8 + 1;
    if (pxVar8[1] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar8 = xmlParseName(ctxt);
    if (pxVar8 != (xmlChar *)0x0) {
      xmlSkipBlankChars(ctxt);
      pxVar10 = ctxt->input;
      if (((pxVar10->flags & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      iVar13 = 0;
      do {
        pbVar4 = ctxt->input->cur;
        bVar1 = *pbVar4;
        if (bVar1 == 0x2f) {
          if (pbVar4[1] == 0x3e) {
LAB_0013794e:
            if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                (p_Var5 = ctxt->sax->startElement, p_Var5 != (startElementSAXFunc)0x0)) &&
               (ctxt->disableSAX == 0)) {
              ppxVar9 = (xmlChar **)0x0;
              if (0 < iVar13) {
                ppxVar9 = ppxVar15;
              }
              (*p_Var5)(ctxt->userData,pxVar8,ppxVar9);
            }
            if (ppxVar15 == (xmlChar **)0x0) {
              return pxVar8;
            }
            for (lVar16 = 1; lVar16 < iVar13; lVar16 = lVar16 + 2) {
              if (ppxVar15[lVar16] != (xmlChar *)0x0) {
                (*xmlFree)(ppxVar15[lVar16]);
              }
            }
            return pxVar8;
          }
        }
        else if ((bVar1 == 0x3e) || ((1 < (byte)(bVar1 - 9) && (bVar1 != 0xd && bVar1 < 0x20))))
        goto LAB_0013794e;
        if ((1 < ctxt->disableSAX) ||
           (str2 = xmlParseAttribute(ctxt,&attvalue), pxVar6 = attvalue, str2 == (xmlChar *)0x0))
        goto LAB_0013794e;
        ppxVar9 = ppxVar15;
        if (attvalue != (xmlChar *)0x0) {
          lVar14 = (long)iVar13;
          lVar16 = 0;
          do {
            if (lVar14 <= lVar16) {
              if ((int)uVar3 < iVar13 + 4) {
                uVar12 = 0xb;
                if ((int)uVar3 < 1) {
LAB_00137830:
                  ppxVar9 = (xmlChar **)(*xmlRealloc)(ppxVar15,(ulong)uVar12 << 4);
                  if (ppxVar9 != (xmlChar **)0x0) {
                    uVar3 = uVar12 * 2;
                    ctxt->atts = ppxVar9;
                    ctxt->maxatts = uVar3;
                    goto LAB_00137866;
                  }
                }
                else if (uVar3 < 100000000) {
                  uVar11 = uVar3 + 1 >> 1;
                  uVar12 = uVar11 + uVar3;
                  if (100000000 - uVar11 < uVar3) {
                    uVar12 = 100000000;
                  }
                  goto LAB_00137830;
                }
                xmlCtxtErrMemory(ctxt);
                goto LAB_00137897;
              }
LAB_00137866:
              ppxVar9[lVar14] = str2;
              iVar13 = iVar13 + 2;
              ppxVar9[lVar14 + 1] = attvalue;
              ppxVar9[lVar14 + 2] = (xmlChar *)0x0;
              (ppxVar9 + lVar14 + 2)[1] = (xmlChar *)0x0;
              attvalue = (xmlChar *)0x0;
              goto LAB_001378aa;
            }
            iVar7 = xmlStrEqual(ppxVar15[lVar16],str2);
            lVar16 = lVar16 + 2;
          } while (iVar7 == 0);
          xmlErrAttributeDup(ctxt,(xmlChar *)0x0,str2);
LAB_00137897:
          (*xmlFree)(pxVar6);
          ppxVar9 = ppxVar15;
        }
LAB_001378aa:
        pxVar10 = ctxt->input;
        if (((pxVar10->flags & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlParserGrow(ctxt);
          pxVar10 = ctxt->input;
        }
        xVar2 = *pxVar10->cur;
        if (xVar2 == '/') {
          xVar2 = pxVar10->cur[1];
        }
        ppxVar15 = ppxVar9;
        if (xVar2 == '>') goto LAB_0013794e;
        iVar7 = xmlSkipBlankChars(ctxt);
        if (iVar7 == 0) {
          xmlFatalErrMsg(ctxt,XML_ERR_SPACE_REQUIRED,"attributes construct error\n");
        }
        pxVar10 = ctxt->input;
        uVar12 = pxVar10->flags;
        if ((uVar12 & 0x40) == 0) {
          xmlParserShrink(ctxt);
          pxVar10 = ctxt->input;
          uVar12 = pxVar10->flags;
        }
        if (((uVar12 & 0x40) == 0) && ((long)pxVar10->end - (long)pxVar10->cur < 0xfa)) {
          xmlParserGrow(ctxt);
        }
      } while( true );
    }
    xmlFatalErrMsg(ctxt,XML_ERR_NAME_REQUIRED,"xmlParseStartTag: invalid element name\n");
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlParseStartTag(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *attname;
    xmlChar *attvalue;
    const xmlChar **atts = ctxt->atts;
    int nbatts = 0;
    int maxatts = ctxt->maxatts;
    int i;

    if (RAW != '<') return(NULL);
    NEXT1;

    name = xmlParseName(ctxt);
    if (name == NULL) {
	xmlFatalErrMsg(ctxt, XML_ERR_NAME_REQUIRED,
	     "xmlParseStartTag: invalid element name\n");
        return(NULL);
    }

    /*
     * Now parse the attributes, it ends up with the ending
     *
     * (S Attribute)* S?
     */
    SKIP_BLANKS;
    GROW;

    while (((RAW != '>') &&
	   ((RAW != '/') || (NXT(1) != '>')) &&
	   (IS_BYTE_CHAR(RAW))) && (PARSER_STOPPED(ctxt) == 0)) {
	attname = xmlParseAttribute(ctxt, &attvalue);
        if (attname == NULL)
	    break;
        if (attvalue != NULL) {
	    /*
	     * [ WFC: Unique Att Spec ]
	     * No attribute name may appear more than once in the same
	     * start-tag or empty-element tag.
	     */
	    for (i = 0; i < nbatts;i += 2) {
	        if (xmlStrEqual(atts[i], attname)) {
		    xmlErrAttributeDup(ctxt, NULL, attname);
		    goto failed;
		}
	    }
	    /*
	     * Add the pair to atts
	     */
	    if (nbatts + 4 > maxatts) {
	        const xmlChar **n;
                int newSize;

                newSize = xmlGrowCapacity(maxatts, sizeof(n[0]) * 2,
                                          11, XML_MAX_ATTRS);
                if (newSize < 0) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                if (newSize < 2)
                    newSize = 2;
#endif
	        n = xmlRealloc(atts, newSize * sizeof(n[0]) * 2);
		if (n == NULL) {
		    xmlErrMemory(ctxt);
		    goto failed;
		}
		atts = n;
                maxatts = newSize * 2;
		ctxt->atts = atts;
		ctxt->maxatts = maxatts;
	    }

	    atts[nbatts++] = attname;
	    atts[nbatts++] = attvalue;
	    atts[nbatts] = NULL;
	    atts[nbatts + 1] = NULL;

            attvalue = NULL;
	}

failed:

        if (attvalue != NULL)
            xmlFree(attvalue);

	GROW
	if ((RAW == '>') || (((RAW == '/') && (NXT(1) == '>'))))
	    break;
	if (SKIP_BLANKS == 0) {
	    xmlFatalErrMsg(ctxt, XML_ERR_SPACE_REQUIRED,
			   "attributes construct error\n");
	}
	SHRINK;
        GROW;
    }

    /*
     * SAX: Start of Element !
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->startElement != NULL) &&
	(!ctxt->disableSAX)) {
	if (nbatts > 0)
	    ctxt->sax->startElement(ctxt->userData, name, atts);
	else
	    ctxt->sax->startElement(ctxt->userData, name, NULL);
    }

    if (atts != NULL) {
        /* Free only the content strings */
        for (i = 1;i < nbatts;i+=2)
	    if (atts[i] != NULL)
	       xmlFree((xmlChar *) atts[i]);
    }
    return(name);
}